

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MT.h
# Opt level: O0

int GetLatestData2MT(MT *pMT,MTDATA *pMTData)

{
  int iVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double local_8d8;
  double local_8d0;
  double local_860;
  double yaw;
  double pitch;
  double roll;
  undefined2 local_83e;
  uInt_MT ul;
  uint uStack_838;
  uShort_MT us;
  int precisionoutputsettings;
  int size;
  int dataidentifier;
  int offset;
  int nbdatabytes;
  uchar databuf [2048];
  MTDATA *pMTData_local;
  MT *pMT_local;
  
  dataidentifier = 0;
  size = 0;
  precisionoutputsettings = 0;
  uStack_838 = 0;
  ul.v = 0;
  pitch = 0.0;
  yaw = 0.0;
  local_860 = 0.0;
  memset(&offset,0,0x800);
  dataidentifier = 0;
  iVar1 = GetLatestMTMessageMT(pMT,0xff,0x36,(uchar *)&offset,0x800,&dataidentifier);
  if (iVar1 == 0) {
    memset(pMTData,0,0x130);
    if (dataidentifier < 3) {
      printf("Error reading data from a MT : Empty MTDATA2 message. \n");
      pMT_local._4_4_ = 1;
    }
    else {
      while (size + 3 <= dataidentifier) {
        local_83e = CONCAT11(*(undefined1 *)((long)&offset + (long)size),
                             *(undefined1 *)((long)&offset + (long)(size + 1)));
        precisionoutputsettings = (int)local_83e;
        uStack_838 = (uint)*(byte *)((long)&offset + (long)(size + 2));
        iVar1 = size + 3;
        if (dataidentifier < (int)(iVar1 + uStack_838)) {
          size = iVar1;
          printf("Error reading data from a MT : Bad packet. \n");
          return 1;
        }
        ul.v = precisionoutputsettings << 2;
        uVar2 = precisionoutputsettings & 0xfff0;
        if (uVar2 == 0x810) {
          size = iVar1;
          size = ConvertToDoubleMT(ul.v,(uchar *)&offset,iVar1,&pMTData->temp);
        }
        else if (uVar2 == 0x1010) {
          roll._4_4_ = CONCAT13(*(undefined1 *)((long)&offset + (long)iVar1),
                                CONCAT12(*(undefined1 *)((long)&offset + (long)(size + 4)),
                                         CONCAT11(*(undefined1 *)((long)&offset + (long)(size + 5)),
                                                  *(undefined1 *)((long)&offset + (long)(size + 6)))
                                        ));
          (pMTData->UTCTime).Nanoseconds = roll._4_4_;
          local_83e = CONCAT11(*(undefined1 *)((long)&offset + (long)(size + 7)),
                               *(undefined1 *)((long)&offset + (long)(size + 8)));
          (pMTData->UTCTime).Year = local_83e;
          (pMTData->UTCTime).Month = *(uchar *)((long)&offset + (long)(size + 9));
          (pMTData->UTCTime).Day = *(uchar *)((long)&offset + (long)(size + 10));
          (pMTData->UTCTime).Hour = *(uchar *)((long)&offset + (long)(size + 0xb));
          (pMTData->UTCTime).Minute = *(uchar *)((long)&offset + (long)(size + 0xc));
          (pMTData->UTCTime).Seconds = *(uchar *)((long)&offset + (long)(size + 0xd));
          (pMTData->UTCTime).Valid = *(uchar *)((long)&offset + (long)(size + 0xe));
          size = size + 0xf;
        }
        else if (uVar2 == 0x1020) {
          local_83e = CONCAT11(*(undefined1 *)((long)&offset + (long)iVar1),
                               *(undefined1 *)((long)&offset + (long)(size + 4)));
          pMTData->TS = local_83e;
          size = size + 5;
        }
        else if (uVar2 == 0x2010) {
          size = iVar1;
          size = ConvertToDoubleMT(ul.v,(uchar *)&offset,iVar1,&pMTData->q0);
          size = ConvertToDoubleMT(ul.v,(uchar *)&offset,size,&pMTData->q1);
          size = ConvertToDoubleMT(ul.v,(uchar *)&offset,size,&pMTData->q2);
          size = ConvertToDoubleMT(ul.v,(uchar *)&offset,size,&pMTData->q3);
          quaternion2euler(pMTData->q0,pMTData->q1,pMTData->q2,pMTData->q3,&pitch,&yaw,&local_860);
          pMTData->roll = (pitch * 180.0) / 3.141592653589793;
          pMTData->pitch = (yaw * 180.0) / 3.141592653589793;
          pMTData->yaw = (local_860 * 180.0) / 3.141592653589793;
          dVar3 = pitch + pMT->rollorientation;
          dVar5 = pMT->rollp1;
          dVar4 = cos(pitch + pMT->rollp2);
          dVar5 = fmod_2PI(dVar5 * dVar4 + dVar3);
          pMTData->Roll = dVar5;
          dVar3 = yaw + pMT->pitchorientation;
          dVar5 = pMT->pitchp1;
          dVar4 = cos(yaw + pMT->pitchp2);
          dVar5 = fmod_2PI(dVar5 * dVar4 + dVar3);
          pMTData->Pitch = dVar5;
          dVar3 = local_860 + pMT->yaworientation;
          dVar5 = pMT->yawp1;
          dVar4 = cos(local_860 + pMT->yawp2);
          dVar5 = fmod_2PI(dVar5 * dVar4 + dVar3);
          pMTData->Yaw = dVar5;
        }
        else if (uVar2 == 0x2020) {
          size = iVar1;
          size = ConvertToDoubleMT(ul.v,(uchar *)&offset,iVar1,&pMTData->a);
          size = ConvertToDoubleMT(ul.v,(uchar *)&offset,size,&pMTData->b);
          size = ConvertToDoubleMT(ul.v,(uchar *)&offset,size,&pMTData->c);
          size = ConvertToDoubleMT(ul.v,(uchar *)&offset,size,&pMTData->d);
          size = ConvertToDoubleMT(ul.v,(uchar *)&offset,size,&pMTData->e);
          size = ConvertToDoubleMT(ul.v,(uchar *)&offset,size,&pMTData->f);
          size = ConvertToDoubleMT(ul.v,(uchar *)&offset,size,&pMTData->g);
          size = ConvertToDoubleMT(ul.v,(uchar *)&offset,size,&pMTData->h);
          size = ConvertToDoubleMT(ul.v,(uchar *)&offset,size,&pMTData->i);
          pitch = atan2(pMTData->f,pMTData->i);
          if (-1.0 < pMTData->c || pMTData->c == -1.0) {
            if (pMTData->c <= 1.0) {
              local_8d8 = pMTData->c;
            }
            else {
              local_8d8 = 1.0;
            }
            local_8d0 = local_8d8;
          }
          else {
            local_8d0 = -1.0;
          }
          dVar5 = asin(local_8d0);
          yaw = -dVar5;
          local_860 = atan2(pMTData->b,pMTData->a);
          pMTData->roll = (pitch * 180.0) / 3.141592653589793;
          pMTData->pitch = (yaw * 180.0) / 3.141592653589793;
          pMTData->yaw = (local_860 * 180.0) / 3.141592653589793;
          dVar3 = pitch + pMT->rollorientation;
          dVar5 = pMT->rollp1;
          dVar4 = cos(pitch + pMT->rollp2);
          dVar5 = fmod_2PI(dVar5 * dVar4 + dVar3);
          pMTData->Roll = dVar5;
          dVar3 = yaw + pMT->pitchorientation;
          dVar5 = pMT->pitchp1;
          dVar4 = cos(yaw + pMT->pitchp2);
          dVar5 = fmod_2PI(dVar5 * dVar4 + dVar3);
          pMTData->Pitch = dVar5;
          dVar3 = local_860 + pMT->yaworientation;
          dVar5 = pMT->yawp1;
          dVar4 = cos(local_860 + pMT->yawp2);
          dVar5 = fmod_2PI(dVar5 * dVar4 + dVar3);
          pMTData->Yaw = dVar5;
        }
        else if (uVar2 == 0x2030) {
          size = iVar1;
          size = ConvertToDoubleMT(ul.v,(uchar *)&offset,iVar1,&pMTData->roll);
          size = ConvertToDoubleMT(ul.v,(uchar *)&offset,size,&pMTData->pitch);
          size = ConvertToDoubleMT(ul.v,(uchar *)&offset,size,&pMTData->yaw);
          pitch = (pMTData->roll * 3.141592653589793) / 180.0;
          yaw = (pMTData->pitch * 3.141592653589793) / 180.0;
          local_860 = (pMTData->yaw * 3.141592653589793) / 180.0;
          dVar3 = pitch + pMT->rollorientation;
          dVar5 = pMT->rollp1;
          dVar4 = cos(pitch + pMT->rollp2);
          dVar5 = fmod_2PI(dVar5 * dVar4 + dVar3);
          pMTData->Roll = dVar5;
          dVar3 = yaw + pMT->pitchorientation;
          dVar5 = pMT->pitchp1;
          dVar4 = cos(yaw + pMT->pitchp2);
          dVar5 = fmod_2PI(dVar5 * dVar4 + dVar3);
          pMTData->Pitch = dVar5;
          dVar3 = local_860 + pMT->yaworientation;
          dVar5 = pMT->yawp1;
          dVar4 = cos(local_860 + pMT->yawp2);
          dVar5 = fmod_2PI(dVar5 * dVar4 + dVar3);
          pMTData->Yaw = dVar5;
        }
        else if (uVar2 == 0x4020) {
          size = iVar1;
          size = ConvertToDoubleMT(ul.v,(uchar *)&offset,iVar1,&pMTData->accX);
          size = ConvertToDoubleMT(ul.v,(uchar *)&offset,size,&pMTData->accY);
          size = ConvertToDoubleMT(ul.v,(uchar *)&offset,size,&pMTData->accZ);
        }
        else if (uVar2 == 0x5020) {
          size = iVar1;
          size = ConvertToDoubleMT(ul.v,(uchar *)&offset,iVar1,&pMTData->Alt);
        }
        else if (uVar2 == 0x5040) {
          size = iVar1;
          size = ConvertToDoubleMT(ul.v,(uchar *)&offset,iVar1,&pMTData->Lat);
          size = ConvertToDoubleMT(ul.v,(uchar *)&offset,size,&pMTData->Long);
        }
        else if (uVar2 == 0x8020) {
          size = iVar1;
          size = ConvertToDoubleMT(ul.v,(uchar *)&offset,iVar1,&pMTData->gyrX);
          size = ConvertToDoubleMT(ul.v,(uchar *)&offset,size,&pMTData->gyrY);
          size = ConvertToDoubleMT(ul.v,(uchar *)&offset,size,&pMTData->gyrZ);
        }
        else if (uVar2 == 0xb010) {
          local_83e = CONCAT11(*(undefined1 *)((long)&offset + (long)iVar1),
                               *(undefined1 *)((long)&offset + (long)(size + 4)));
          pMTData->Ain_1 = local_83e;
          size = size + 5;
        }
        else if (uVar2 == 0xb020) {
          local_83e = CONCAT11(*(undefined1 *)((long)&offset + (long)iVar1),
                               *(undefined1 *)((long)&offset + (long)(size + 4)));
          pMTData->Ain_2 = local_83e;
          size = size + 5;
        }
        else if (uVar2 == 0xc020) {
          size = iVar1;
          size = ConvertToDoubleMT(ul.v,(uchar *)&offset,iVar1,&pMTData->magX);
          size = ConvertToDoubleMT(ul.v,(uchar *)&offset,size,&pMTData->magY);
          size = ConvertToDoubleMT(ul.v,(uchar *)&offset,size,&pMTData->magZ);
        }
        else if (uVar2 == 0xd010) {
          size = iVar1;
          size = ConvertToDoubleMT(ul.v,(uchar *)&offset,iVar1,&pMTData->Vel_X);
          size = ConvertToDoubleMT(ul.v,(uchar *)&offset,size,&pMTData->Vel_Y);
          size = ConvertToDoubleMT(ul.v,(uchar *)&offset,size,&pMTData->Vel_Z);
        }
        else if (uVar2 == 0xe010) {
          pMTData->Status = *(uchar *)((long)&offset + (long)iVar1);
          size = size + 4;
        }
        else {
          size = uStack_838 + iVar1;
        }
      }
      memcpy(&pMT->LastMTData,pMTData,0x130);
      pMT_local._4_4_ = 0;
    }
  }
  else {
    pMT_local._4_4_ = 1;
  }
  return pMT_local._4_4_;
}

Assistant:

inline int GetLatestData2MT(MT* pMT, MTDATA* pMTData)
{
	unsigned char databuf[MAX_NB_BYTES_MT];
	int nbdatabytes = 0;
	int offset = 0;
	int dataidentifier = 0;
	int size = 0;
	int precisionoutputsettings = 0;
	uShort_MT us;
	uInt_MT ul;
	double roll = 0, pitch = 0, yaw = 0;

	memset(databuf, 0, sizeof(databuf));
	nbdatabytes = 0;
	if (GetLatestMTMessageMT(pMT, ADDR_MT, MTDATA2_MID, databuf, sizeof(databuf), &nbdatabytes)
		!= EXIT_SUCCESS)
	{ 
		return EXIT_FAILURE;	
	}

	// Analyze data.

	memset(pMTData, 0, sizeof(MTDATA));

	if (nbdatabytes < 3) 
	{
		printf("Error reading data from a MT : Empty MTDATA2 message. \n");
		return EXIT_FAILURE;
	}

	// Might not be good if all data are not at the same output frequency...?

	while (nbdatabytes >= offset+3) 
	{
		// Get Data Identifier and Size of the packet.
		us.c[0] = databuf[1+offset];
		us.c[1] = databuf[0+offset];
		dataidentifier = us.v;
		size = databuf[2+offset];
		offset += 3;
		if (nbdatabytes < offset+size) 
		{
			printf("Error reading data from a MT : Bad packet. \n");
			return EXIT_FAILURE;
		}
		precisionoutputsettings = (dataidentifier<<2);
		switch (dataidentifier & XDI_FullTypeMask)
		{
		case XDI_Temperature:
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->temp);
			break;
		case XDI_UtcTime:
			ul.c[0] = databuf[3+offset];
			ul.c[1] = databuf[2+offset];
			ul.c[2] = databuf[1+offset];
			ul.c[3] = databuf[0+offset];
			pMTData->UTCTime.Nanoseconds = ul.v;
			offset += 4;
			us.c[0] = databuf[1+offset];
			us.c[1] = databuf[0+offset];
			pMTData->UTCTime.Year = us.v;
			offset += 2;
			pMTData->UTCTime.Month = databuf[offset];
			offset += 1;
			pMTData->UTCTime.Day = databuf[offset];
			offset += 1;
			pMTData->UTCTime.Hour = databuf[offset];
			offset += 1;
			pMTData->UTCTime.Minute = databuf[offset];
			offset += 1;
			pMTData->UTCTime.Seconds = databuf[offset];
			offset += 1;
			pMTData->UTCTime.Valid = databuf[offset];
			offset += 1;
			break;
		case XDI_PacketCounter:
			us.c[0] = databuf[1+offset];
			us.c[1] = databuf[0+offset];
			pMTData->TS = us.v;
			offset += 2;
			break;
		case XDI_Quaternion:
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->q0);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->q1);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->q2);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->q3);
			quaternion2euler(pMTData->q0, pMTData->q1, pMTData->q2, pMTData->q3, &roll, &pitch, &yaw);
			//yaw = fmod_2PI(yaw-M_PI/2.0); // Coordinate system different from legacy mode...
			
			// If raw Euler angles were not sent, ensure that they would still be in the log file.
			pMTData->roll = roll*180.0/M_PI;
			pMTData->pitch = pitch*180.0/M_PI;
			pMTData->yaw = yaw*180.0/M_PI;

			// Apply corrections (magnetic, orientation of the sensor w.r.t. coordinate system...).
			pMTData->Roll = fmod_2PI(roll+pMT->rollorientation+pMT->rollp1*cos(roll+pMT->rollp2));
			pMTData->Pitch = fmod_2PI(pitch+pMT->pitchorientation+pMT->pitchp1*cos(pitch+pMT->pitchp2));
			pMTData->Yaw = fmod_2PI(yaw+pMT->yaworientation+pMT->yawp1*cos(yaw+pMT->yawp2));
			break;
		case XDI_EulerAngles:
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->roll);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->pitch);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->yaw);
			roll = pMTData->roll*M_PI/180.0;
			pitch = pMTData->pitch*M_PI/180.0;
			yaw = pMTData->yaw*M_PI/180.0;
			//yaw = fmod_2PI(yaw-M_PI/2.0); // Coordinate system different from legacy mode...
	
			// Apply corrections (magnetic, orientation of the sensor w.r.t. coordinate system...).
			pMTData->Roll = fmod_2PI(roll+pMT->rollorientation+pMT->rollp1*cos(roll+pMT->rollp2));
			pMTData->Pitch = fmod_2PI(pitch+pMT->pitchorientation+pMT->pitchp1*cos(pitch+pMT->pitchp2));
			pMTData->Yaw = fmod_2PI(yaw+pMT->yaworientation+pMT->yawp1*cos(yaw+pMT->yawp2));
			break;
		case XDI_RotationMatrix:
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->a);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->b);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->c);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->d);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->e);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->f);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->g);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->h);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->i);
			roll = atan2(pMTData->f,pMTData->i);
			pitch = -asin(constrain(pMTData->c, -1, 1)); // Attempt to avoid potential NAN...
			yaw = atan2(pMTData->b,pMTData->a);
			//yaw = fmod_2PI(yaw-M_PI/2.0); // Coordinate system different from legacy mode...
		
			// If raw Euler angles were not sent, ensure that they would still be in the log file.
			pMTData->roll = roll*180.0/M_PI;
			pMTData->pitch = pitch*180.0/M_PI;
			pMTData->yaw = yaw*180.0/M_PI;

			// Apply corrections (magnetic, orientation of the sensor w.r.t. coordinate system...).
			pMTData->Roll = fmod_2PI(roll+pMT->rollorientation+pMT->rollp1*cos(roll+pMT->rollp2));
			pMTData->Pitch = fmod_2PI(pitch+pMT->pitchorientation+pMT->pitchp1*cos(pitch+pMT->pitchp2));
			pMTData->Yaw = fmod_2PI(yaw+pMT->yaworientation+pMT->yawp1*cos(yaw+pMT->yawp2));
			break;
		case XDI_Acceleration:
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->accX);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->accY);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->accZ);
			break;
		case XDI_RateOfTurn:
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->gyrX);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->gyrY);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->gyrZ);
			break;
		case XDI_MagneticField:
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->magX);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->magY);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->magZ);
			break;
		case XDI_StatusByte:
			pMTData->Status = databuf[offset];
			offset += 1;
			break;
		case XDI_AnalogIn1:
			us.c[0] = databuf[1+offset];
			us.c[1] = databuf[0+offset];
			pMTData->Ain_1 = us.v;
			offset += 2;
			break;
		case XDI_AnalogIn2:
			us.c[0] = databuf[1+offset];
			us.c[1] = databuf[0+offset];
			pMTData->Ain_2 = us.v;
			offset += 2;
			break;
		case XDI_LatLon:
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->Lat);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->Long);
			break;
		case XDI_AltitudeEllipsoid:
			// Altitude Mean Sea Level or WGS84 in MTDATA message?
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->Alt);
			break;
		case XDI_VelocityXYZ:
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->Vel_X);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->Vel_Y);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->Vel_Z);
			break;
		default:
			// Skipping an unknown packet...
			offset += size;
			break;
		}
	}

	pMT->LastMTData = *pMTData;

	return EXIT_SUCCESS;
}